

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O0

void Curl_sock_assign_addr(Curl_sockaddr_ex *dest,Curl_addrinfo *ai,int transport)

{
  int transport_local;
  Curl_addrinfo *ai_local;
  Curl_sockaddr_ex *dest_local;
  
  dest->family = ai->ai_family;
  if (transport == 3) {
    dest->socktype = 1;
    dest->protocol = 6;
  }
  else if (transport == 6) {
    dest->socktype = 1;
    dest->protocol = 0;
  }
  else {
    dest->socktype = 2;
    dest->protocol = 0x11;
  }
  dest->addrlen = ai->ai_addrlen;
  if (0x80 < dest->addrlen) {
    dest->addrlen = 0x80;
  }
  memcpy(&dest->_sa_ex_u,ai->ai_addr,(ulong)dest->addrlen);
  return;
}

Assistant:

void Curl_sock_assign_addr(struct Curl_sockaddr_ex *dest,
                           const struct Curl_addrinfo *ai,
                           int transport)
{
  /*
   * The Curl_sockaddr_ex structure is basically libcurl's external API
   * curl_sockaddr structure with enough space available to directly hold
   * any protocol-specific address structures. The variable declared here
   * will be used to pass / receive data to/from the fopensocket callback
   * if this has been set, before that, it is initialized from parameters.
   */
  dest->family = ai->ai_family;
  switch(transport) {
  case TRNSPRT_TCP:
    dest->socktype = SOCK_STREAM;
    dest->protocol = IPPROTO_TCP;
    break;
  case TRNSPRT_UNIX:
    dest->socktype = SOCK_STREAM;
    dest->protocol = IPPROTO_IP;
    break;
  default: /* UDP and QUIC */
    dest->socktype = SOCK_DGRAM;
    dest->protocol = IPPROTO_UDP;
    break;
  }
  dest->addrlen = (unsigned int)ai->ai_addrlen;

  if(dest->addrlen > sizeof(struct Curl_sockaddr_storage))
    dest->addrlen = sizeof(struct Curl_sockaddr_storage);
  memcpy(&dest->curl_sa_addr, ai->ai_addr, dest->addrlen);
}